

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

SchemaCatalogEntry * __thiscall
duckdb::Catalog::GetSchema(Catalog *this,ClientContext *context,EntryLookupInfo *schema_lookup)

{
  int iVar1;
  undefined4 extraout_var;
  CatalogTransaction local_40;
  
  CatalogTransaction::CatalogTransaction(&local_40,this,context);
  iVar1 = (*this->_vptr_Catalog[8])(this,schema_lookup,0);
  local_40.db.ptr = (DatabaseInstance *)CONCAT44(extraout_var,iVar1);
  optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)&local_40);
  return (SchemaCatalogEntry *)local_40.db.ptr;
}

Assistant:

SchemaCatalogEntry &Catalog::GetSchema(ClientContext &context, const EntryLookupInfo &schema_lookup) {
	return *Catalog::GetSchema(context, schema_lookup, OnEntryNotFound::THROW_EXCEPTION);
}